

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvParseLiteralMv(Io_MvMod_t *p,Abc_Obj_t *pNode,char *pToken,Vec_Str_t *vFunc,int iLit)

{
  Io_MvMan_t *pIVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *pObj;
  char *pcVar6;
  uint *puVar7;
  Abc_Obj_t *local_90;
  uint local_6c;
  char *pcStack_68;
  int i;
  char *pNext;
  char *pCur;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pFanin;
  Io_MvVar_t *pVar;
  char Buffer [10];
  int iLit_local;
  Vec_Str_t *vFunc_local;
  char *pToken_local;
  Abc_Obj_t *pNode_local;
  Io_MvMod_t *p_local;
  
  Buffer._2_4_ = iLit;
  unique0x1000037c = vFunc;
  if (*pToken == '=') {
    for (local_6c = 0; iVar4 = Abc_ObjFaninNum(pNode), (int)local_6c < iVar4;
        local_6c = local_6c + 1) {
      pObj = Abc_ObjFanin(pNode,local_6c);
      pcVar6 = Abc_ObjName(pObj);
      iVar4 = strcmp(pcVar6,pToken + 1);
      if (iVar4 == 0) break;
    }
    uVar5 = Abc_ObjFaninNum(pNode);
    if (local_6c == uVar5) {
      pIVar1 = p->pMan;
      uVar5 = Io_MvGetLine(p->pMan,pToken);
      sprintf(pIVar1->sError,
              "Line %d: Node name in the table \"%s\" cannot be found on .names line.",(ulong)uVar5,
              pToken + 1);
      p_local._4_4_ = 0;
    }
    else {
      Vec_StrPush(stack0xffffffffffffffd0,'=');
      sprintf((char *)((long)&pVar + 2),"%d",(ulong)local_6c);
      Vec_StrPrintStr(stack0xffffffffffffffd0,(char *)((long)&pVar + 2));
      cVar3 = ' ';
      if (Buffer._2_4_ == -1) {
        cVar3 = '\n';
      }
      Vec_StrPush(stack0xffffffffffffffd0,cVar3);
      p_local._4_4_ = 1;
    }
  }
  else {
    iVar4 = Abc_ObjFaninNum(pNode);
    if (iVar4 <= iLit) {
      __assert_fail("iLit < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                    ,0x694,
                    "int Io_MvParseLiteralMv(Io_MvMod_t *, Abc_Obj_t *, char *, Vec_Str_t *, int)");
    }
    if ((int)Buffer._2_4_ < 0) {
      local_90 = Abc_ObjFanout0(pNode);
    }
    else {
      local_90 = Abc_ObjFanin(pNode,Buffer._2_4_);
    }
    puVar7 = (uint *)Abc_ObjMvVar(local_90);
    if ((puVar7 == (uint *)0x0) || (pNext = pToken, *(long *)(puVar7 + 2) == 0)) {
      Vec_StrPrintStr(stack0xffffffffffffffd0,pToken);
      cVar3 = ' ';
      if (Buffer._2_4_ == -1) {
        cVar3 = '\n';
      }
      Vec_StrPush(stack0xffffffffffffffd0,cVar3);
      p_local._4_4_ = 1;
    }
    else {
      for (; *pNext != '\0'; pNext = pNext + 1) {
        iVar4 = Io_MvCharIsMvSymb(*pNext);
        pcVar6 = pNext;
        if (iVar4 == 0) {
          do {
            pcVar2 = pcVar6;
            pcStack_68 = pcVar2 + 1;
            if (*pcStack_68 == '\0') break;
            iVar4 = Io_MvCharIsMvSymb(*pcStack_68);
            pcVar6 = pcStack_68;
          } while (iVar4 == 0);
          local_6c = 0;
          while (((int)local_6c < (int)*puVar7 &&
                 (iVar4 = strncmp(*(char **)(*(long *)(puVar7 + 2) + (long)(int)local_6c * 8),pNext,
                                  (long)pcStack_68 - (long)pNext), iVar4 != 0))) {
            local_6c = local_6c + 1;
          }
          if (local_6c == *puVar7) {
            *pcStack_68 = '\0';
            pIVar1 = p->pMan;
            uVar5 = Io_MvGetLine(p->pMan,pToken);
            pcVar6 = Abc_ObjName(local_90);
            sprintf(pIVar1->sError,
                    "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\"."
                    ,(ulong)uVar5,pNext,pcVar6);
            return 0;
          }
          sprintf((char *)((long)&pVar + 2),"%d",(ulong)local_6c);
          Vec_StrPrintStr(stack0xffffffffffffffd0,(char *)((long)&pVar + 2));
          pNext = pcVar2;
        }
        else {
          Vec_StrPush(stack0xffffffffffffffd0,*pNext);
        }
      }
      cVar3 = ' ';
      if (Buffer._2_4_ == -1) {
        cVar3 = '\n';
      }
      Vec_StrPush(stack0xffffffffffffffd0,cVar3);
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int Io_MvParseLiteralMv( Io_MvMod_t * p, Abc_Obj_t * pNode, char * pToken, Vec_Str_t * vFunc, int iLit )
{
    char Buffer[10];
    Io_MvVar_t * pVar;
    Abc_Obj_t * pFanin, * pNet;
    char * pCur, * pNext;
    int i;
    // consider the equality literal
    if ( pToken[0] == '=' )
    {
        // find the fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !strcmp( Abc_ObjName(pFanin), pToken + 1 ) )
                break;
        if ( i == Abc_ObjFaninNum(pNode) )
        {
            sprintf( p->pMan->sError, "Line %d: Node name in the table \"%s\" cannot be found on .names line.", 
                Io_MvGetLine(p->pMan, pToken), pToken + 1 );
            return 0;
        }
        Vec_StrPush( vFunc, '=' );
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // consider regular literal
    assert( iLit < Abc_ObjFaninNum(pNode) );
    pNet = iLit >= 0 ? Abc_ObjFanin(pNode, iLit) : Abc_ObjFanout0(pNode);
    pVar = (Io_MvVar_t *)Abc_ObjMvVar( pNet );
    // if the var is absent or has no symbolic values quit
    if ( pVar == NULL || pVar->pNames == NULL )
    {
        Vec_StrPrintStr( vFunc, pToken );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // parse the literal using symbolic values
    for ( pCur = pToken; *pCur; pCur++ )
    {
        if ( Io_MvCharIsMvSymb(*pCur) )
        {
            Vec_StrPush( vFunc, *pCur );
            continue;
        }
        // find the next MvSymb char
        for ( pNext = pCur+1; *pNext; pNext++ )
            if ( Io_MvCharIsMvSymb(*pNext) )
                break;
        // look for the value name
        for ( i = 0; i < pVar->nValues; i++ )
            if ( !strncmp( pVar->pNames[i], pCur, pNext-pCur ) )
                break;
        if ( i == pVar->nValues )
        {
            *pNext = 0;
            sprintf( p->pMan->sError, "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".", 
                Io_MvGetLine(p->pMan, pToken), pCur, Abc_ObjName(pNet) );
            return 0;
        }
        // value name is found
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        // update the pointer
        pCur = pNext - 1;
    }
    Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
    return 1;
}